

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O2

int get_start_shift_convolve(int width,int filt_width,int stride)

{
  int iVar1;
  int iVar2;
  
  iVar2 = (filt_width + -1) / 2;
  iVar1 = width % stride;
  if (width % stride == 0) {
    iVar1 = stride;
  }
  iVar1 = (filt_width % 2 + iVar1 + -1) / 2;
  if (iVar2 <= iVar1) {
    iVar1 = iVar2;
  }
  return iVar1;
}

Assistant:

static inline int get_start_shift_convolve(int width, int filt_width,
                                           int stride) {
  const int mod = (width % stride);
  const int filt_off = (filt_width - 1) / 2;
  const int dif = (mod ? mod - 1 : stride - 1);
  return AOMMIN((dif + (filt_width % 2)) / 2, filt_off);
}